

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

void chacha_init(chacha_state *S,chacha_key *key,chacha_iv *iv,size_t rounds)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *(undefined8 *)key->b;
  uVar2 = *(undefined8 *)(key->b + 8);
  uVar3 = *(undefined8 *)(key->b + 0x18);
  *(undefined8 *)(S->opaque + 0x10) = *(undefined8 *)(key->b + 0x10);
  *(undefined8 *)(S->opaque + 0x18) = uVar3;
  *(undefined8 *)S->opaque = uVar1;
  *(undefined8 *)(S->opaque + 8) = uVar2;
  S->opaque[0x20] = '\0';
  S->opaque[0x21] = '\0';
  S->opaque[0x22] = '\0';
  S->opaque[0x23] = '\0';
  S->opaque[0x24] = '\0';
  S->opaque[0x25] = '\0';
  S->opaque[0x26] = '\0';
  S->opaque[0x27] = '\0';
  *(undefined8 *)(S->opaque + 0x28) = *(undefined8 *)iv->b;
  *(size_t *)(S->opaque + 0x30) = rounds;
  S->opaque[0x38] = '\0';
  S->opaque[0x39] = '\0';
  S->opaque[0x3a] = '\0';
  S->opaque[0x3b] = '\0';
  S->opaque[0x3c] = '\0';
  S->opaque[0x3d] = '\0';
  S->opaque[0x3e] = '\0';
  S->opaque[0x3f] = '\0';
  return;
}

Assistant:

void
chacha_init(chacha_state *S, const chacha_key *key, const chacha_iv *iv, size_t rounds) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    memcpy(state->s + 0, key, 32);
    memset(state->s + 32, 0, 8);
    memcpy(state->s + 40, iv, 8);
    state->rounds = rounds;
    state->leftover = 0;
}